

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_asub_s_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  lVar5 = (long)(int)(env->active_fpu).fpr[ws].fs[0] - (long)(int)(env->active_fpu).fpr[wt].fs[0];
  lVar3 = -lVar5;
  if (0 < lVar5) {
    lVar3 = lVar5;
  }
  (env->active_fpu).fpr[wd].fs[0] = (float32)lVar3;
  lVar5 = (long)*(int *)((long)(env->active_fpu).fpr + lVar4 + 4) -
          (long)*(int *)((long)(env->active_fpu).fpr + lVar2 + 4);
  lVar3 = -lVar5;
  if (0 < lVar5) {
    lVar3 = lVar5;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar1 + 4) = (int)lVar3;
  lVar5 = (long)*(int *)((long)(env->active_fpu).fpr + lVar4 + 8) -
          (long)*(int *)((long)(env->active_fpu).fpr + lVar2 + 8);
  lVar3 = -lVar5;
  if (0 < lVar5) {
    lVar3 = lVar5;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar1 + 8) = (int)lVar3;
  lVar2 = (long)*(int *)((long)(env->active_fpu).fpr + lVar4 + 0xc) -
          (long)*(int *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  lVar3 = -lVar2;
  if (0 < lVar2) {
    lVar3 = lVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar1 + 0xc) = (int)lVar3;
  return;
}

Assistant:

void helper_msa_asub_s_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_asub_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_asub_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_asub_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_asub_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}